

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double ON_MaximumCoordinate(double *data,int dim,bool is_rat,int count,int stride)

{
  double dVar1;
  int local_4c;
  int local_48;
  int j_1;
  int i_1;
  int j;
  double norm_i;
  double w;
  double dStack_28;
  int i;
  double norm;
  int stride_local;
  int count_local;
  bool is_rat_local;
  int dim_local;
  double *data_local;
  
  dStack_28 = 0.0;
  if (is_rat) {
    for (w._4_4_ = 0; w._4_4_ < count; w._4_4_ = w._4_4_ + 1) {
      dVar1 = ABS(data[w._4_4_ * stride + dim]);
      _i_1 = 0.0;
      for (j_1 = 0; j_1 < dim; j_1 = j_1 + 1) {
        _i_1 = ON_Max(_i_1,ABS(data[w._4_4_ * stride + j_1]));
      }
      if ((dStack_28 * dVar1 < _i_1) && (0.0 < dVar1)) {
        dStack_28 = _i_1 / dVar1;
      }
    }
  }
  else {
    for (local_48 = 0; local_48 < count; local_48 = local_48 + 1) {
      for (local_4c = 0; local_4c < dim; local_4c = local_4c + 1) {
        dStack_28 = ON_Max(dStack_28,ABS(data[local_48 * stride + local_4c]));
      }
    }
  }
  return dStack_28;
}

Assistant:

double ON_MaximumCoordinate(const double* data, int dim, bool is_rat, int count, int stride)
{
  double norm = 0;
  if (is_rat)
  {
    for (int i = 0; i < count; i++)
    {
      double w = fabs(data[i*stride + dim ]);
      double norm_i = 0;
      for (int j = 0; j < dim; j++)
        norm_i = ON_Max(norm_i, fabs(data[i*stride + j]));
      if (norm_i > norm * w && w>0)
        norm = norm_i / w;
    }
  }
  else
  {
    for (int i = 0; i < count; i++)
      for (int j=0; j<dim; j++)
        norm = ON_Max(norm, fabs(data[i*stride + j]));
  }
  return norm;
}